

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MagneticField.cpp
# Opt level: O0

void __thiscall OpenMD::MagneticField::initialize(MagneticField *this)

{
  value_type vVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  double *pdVar5;
  long in_RDI;
  vector<double,_std::allocator<double>_> mf;
  Globals *in_stack_ffffffffffffff68;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff78;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff80;
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> local_20;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1915f6);
  bVar2 = Globals::haveMagneticField((Globals *)0x191604);
  if (bVar2) {
    *(undefined1 *)(in_RDI + 0x11) = 1;
    Globals::getMagneticField(in_stack_ffffffffffffff68);
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff80);
  }
  sVar3 = std::vector<double,_std::allocator<double>_>::size(&local_20);
  if (sVar3 != 3) {
    sVar3 = std::vector<double,_std::allocator<double>_>::size(&local_20);
    snprintf(painCave.errMsg,2000,
             "MagneticField: Incorrect number of parameters specified.\n\tthere should be 3 parameters, but %zu were specified.\n"
             ,sVar3);
    painCave.isFatal = 1;
    simError();
  }
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_20,0);
  vVar1 = *pvVar4;
  pdVar5 = Vector3<double>::x((Vector3<double> *)(in_RDI + 0x20));
  *pdVar5 = vVar1;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_20,1);
  this_00 = (vector<double,_std::allocator<double>_> *)*pvVar4;
  pdVar5 = Vector3<double>::y((Vector3<double> *)(in_RDI + 0x20));
  *pdVar5 = (double)this_00;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_20,2);
  vVar1 = *pvVar4;
  pdVar5 = Vector3<double>::z((Vector3<double> *)(in_RDI + 0x20));
  *pdVar5 = vVar1;
  *(undefined1 *)(in_RDI + 0x10) = 1;
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  return;
}

Assistant:

void MagneticField::initialize() {
    std::vector<RealType> mf;

    if (simParams->haveMagneticField()) {
      doMagneticField = true;
      mf              = simParams->getMagneticField();
    }
    if (mf.size() != 3) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "MagneticField: Incorrect number of parameters specified.\n"
               "\tthere should be 3 parameters, but %zu were specified.\n",
               mf.size());
      painCave.isFatal = 1;
      simError();
    }
    MF.x() = mf[0];
    MF.y() = mf[1];
    MF.z() = mf[2];

    initialized = true;
  }